

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O2

void radio_check_invalid_proc
               (Am_Object *group,Am_Object *which_part,int left,int top,int width,int height)

{
  bool bVar1;
  int iVar2;
  int my_top;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Am_Value *pAVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int my_width;
  int final_height;
  int final_width;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object owner;
  int final_top;
  int final_left;
  undefined8 local_40;
  undefined8 local_38;
  
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)group);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    pAVar9 = Am_Object::Get(group,100,7);
    iVar2 = Am_Value::operator_cast_to_int(pAVar9);
    pAVar9 = Am_Object::Get(group,0x65,7);
    my_top = Am_Value::operator_cast_to_int(pAVar9);
    pAVar9 = Am_Object::Get(group,0x66,7);
    iVar3 = Am_Value::operator_cast_to_int(pAVar9);
    local_38 = CONCAT44(extraout_var,iVar3);
    pAVar9 = Am_Object::Get(group,0x67,7);
    iVar3 = Am_Value::operator_cast_to_int(pAVar9);
    local_40 = CONCAT44(extraout_var_00,iVar3);
    pAVar9 = Am_Object::Get(group,0x188,7);
    iVar4 = Am_Value::operator_cast_to_int(pAVar9);
    pAVar9 = Am_Object::Get(group,0x186,7);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar9);
    pAVar9 = Am_Object::Get(which_part,100,7);
    iVar5 = Am_Value::operator_cast_to_int(pAVar9);
    pAVar9 = Am_Object::Get(which_part,0x65,7);
    iVar6 = Am_Value::operator_cast_to_int(pAVar9);
    pAVar9 = Am_Object::Get(which_part,0x66,7);
    iVar7 = Am_Value::operator_cast_to_int(pAVar9);
    pAVar9 = Am_Object::Get(which_part,0x67,7);
    iVar8 = Am_Value::operator_cast_to_int(pAVar9);
    my_width = (int)local_38 - (iVar4 + 5);
    iVar3 = 0;
    if (bVar1) {
      iVar3 = iVar4 + 5;
    }
    Am_Invalid_Rectangle_Intersect
              ((left - iVar5) + (my_width - iVar7) / 2,(top - iVar6) + ((int)local_40 - iVar8) / 2,
               width,height,iVar3 + iVar2,my_top,my_width,(int)local_40,&final_left,&final_top,
               &final_width,&final_height);
    if ((0 < final_width) && (0 < final_height)) {
      Am_Object::Am_Object(&local_70,&owner);
      Am_Object::Am_Object(&local_78,group);
      Am_Invalidate(&local_70,&local_78,final_left,final_top,final_width,final_height);
      Am_Object::~Am_Object(&local_78);
      Am_Object::~Am_Object(&local_70);
    }
  }
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

Am_Define_Method(Am_Invalid_Method, void, radio_check_invalid,
                 (Am_Object group, Am_Object which_part, int left, int top,
                  int width, int height))
{
  const Am_Slot_Flags flags = Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR;
  Am_Object owner = group.Get_Owner(flags);
  if (owner.Valid()) {
    int my_left = group.Get(Am_LEFT, flags);
    int my_top = group.Get(Am_TOP, flags);
    int my_width = group.Get(Am_WIDTH, flags);
    int my_height = group.Get(Am_HEIGHT, flags);
    int box_width = group.Get(Am_BOX_WIDTH, flags);
    bool box_on_left = group.Get(Am_BOX_ON_LEFT, flags);
    int offset_left = 5;
    int part_left = which_part.Get(Am_LEFT, flags);
    int part_top = which_part.Get(Am_TOP, flags);
    int part_width = which_part.Get(Am_WIDTH, flags);
    int part_height = which_part.Get(Am_HEIGHT, flags);
    my_width -= box_width + offset_left;
    if (box_on_left)
      my_left += box_width + offset_left;
    int display_left = (my_width - part_width) / 2;
    int display_top = (my_height - part_height) / 2;
    left = left + display_left - part_left;
    top = top + display_top - part_top;
    int final_left, final_top, final_width, final_height;
    // clip incoming rectangle to my rectangle
    Am_Invalid_Rectangle_Intersect(left, top, width, height, my_left, my_top,
                                   my_width, my_height, final_left, final_top,
                                   final_width, final_height);
    if ((final_width > 0) && (final_height > 0))
      Am_Invalidate(owner, group, final_left, final_top, final_width,
                    final_height);
  }
}